

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  undefined1 local_80 [8];
  scoped_padder p;
  undefined1 local_50 [4];
  uint field_size;
  scoped_padder p_1;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  source_linenum_formatter<spdlog::details::scoped_padder> *this_local;
  
  p_1.spaces_.size_ = (size_t)dest;
  bVar1 = source_loc::empty(&msg->source);
  if (bVar1) {
    scoped_padder::scoped_padder
              ((scoped_padder *)local_50,0,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)p_1.spaces_.size_);
    scoped_padder::~scoped_padder((scoped_padder *)local_50);
  }
  else {
    p.spaces_.size_._4_4_ = scoped_padder::count_digits<int>((msg->source).line);
    scoped_padder::scoped_padder
              ((scoped_padder *)local_80,(ulong)p.spaces_.size_._4_4_,
               &(this->super_flag_formatter).padinfo_,(memory_buf_t *)p_1.spaces_.size_);
    fmt_helper::append_int<int>((msg->source).line,(memory_buf_t *)p_1.spaces_.size_);
    scoped_padder::~scoped_padder((scoped_padder *)local_80);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }